

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O0

int pt_qry_cond_branch(pt_query_decoder *decoder,int *taken)

{
  int iVar1;
  int local_24;
  int errcode;
  int query;
  int *taken_local;
  pt_query_decoder *decoder_local;
  
  if ((decoder == (pt_query_decoder *)0x0) || (taken == (int *)0x0)) {
    return -2;
  }
  local_24 = pt_tnt_cache_query(&decoder->tnt);
  if (local_24 < 0) {
    if (local_24 != -8) {
      return local_24;
    }
    memcpy(&decoder->last_time,&(decoder->evdec).time,0x30);
    iVar1 = pt_qry_cache_tnt(decoder);
    if (iVar1 < 0) {
      return iVar1;
    }
    local_24 = pt_tnt_cache_query(&decoder->tnt);
    if (local_24 < 0) {
      if (local_24 != -8) {
        return local_24;
      }
      if (-1 < decoder->status) {
        return -8;
      }
      return decoder->status;
    }
  }
  *taken = local_24;
  iVar1 = pt_qry_status_flags(decoder);
  return iVar1;
}

Assistant:

int pt_qry_cond_branch(struct pt_query_decoder *decoder, int *taken)
{
	int query;

	if (!decoder || !taken)
		return -pte_invalid;

	query = pt_tnt_cache_query(&decoder->tnt);
	if (query < 0) {
		int errcode;

		if (query != -pte_bad_query)
			return query;

		/* If we ran out of TNT bits, check if the current event
		 * provides any.
		 *
		 * Preserve the time at the TNT event.
		 */
		decoder->last_time = decoder->evdec.time;

		errcode = pt_qry_cache_tnt(decoder);
		if (errcode < 0)
			return errcode;

		query = pt_tnt_cache_query(&decoder->tnt);
		if (query < 0) {
			if (query != -pte_bad_query)
				return query;

			/* Report any deferred event decode errors.
			 *
			 * We deferred them until we consumed the last TNT bit
			 * in our cache.
			 */
			errcode = decoder->status;
			if (errcode < 0)
				return errcode;

			return query;
		}
	}

	*taken = query;

	return pt_qry_status_flags(decoder);
}